

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdflogger_handle qpdf_get_logger(qpdf_data qpdf)

{
  _qpdflogger_handle *this;
  shared_ptr<QPDFLogger> local_20;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  this = (_qpdflogger_handle *)operator_new(0x10);
  std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_10);
  QPDF::getLogger((QPDF *)&local_20);
  _qpdflogger_handle::_qpdflogger_handle(this,&local_20);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_20);
  return this;
}

Assistant:

qpdflogger_handle
qpdf_get_logger(qpdf_data qpdf)
{
    return new _qpdflogger_handle(qpdf->qpdf->getLogger());
}